

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

void process_example(vw *all,bfgs *b,example *ec)

{
  float fVar1;
  float *pfVar2;
  loss_function *plVar3;
  shared_data *psVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  
  if (b->first_pass == true) {
    b->importance_weight_sum = (double)ec->weight + b->importance_weight_sum;
  }
  if (b->gradient_pass == true) {
    fVar8 = predict_and_gradient(all,ec);
    (ec->pred).scalar = fVar8;
    (*all->loss->_vptr_loss_function[1])
              (CONCAT44(extraout_XMM0_Db,fVar8),(ulong)(ec->l).multi.label,all->loss,all->sd);
    fVar8 = extraout_XMM0_Da * ec->weight;
    ec->loss = fVar8;
    b->loss_sum = (double)fVar8 + b->loss_sum;
    v_array<float>::push_back(&b->predictions,&(ec->pred).scalar);
  }
  else {
    fVar8 = dot_with_direction(all,ec);
    uVar7 = b->example_number;
    pfVar2 = (b->predictions)._begin;
    uVar6 = (long)(b->predictions)._end - (long)pfVar2 >> 2;
    if (uVar6 <= uVar7) {
      uVar7 = uVar6 - 1;
      b->example_number = uVar7;
    }
    fVar1 = pfVar2[uVar7];
    (ec->pred).multiclass = (uint32_t)fVar1;
    ec->partial_prediction = (b->predictions)._begin[b->example_number];
    (*all->loss->_vptr_loss_function[1])
              ((ulong)(uint)fVar1,(ulong)(ec->l).multi.label,all->loss,all->sd);
    ec->loss = extraout_XMM0_Da_00 * ec->weight;
    plVar3 = all->loss;
    psVar4 = all->sd;
    pfVar2 = (b->predictions)._begin;
    sVar5 = b->example_number;
    b->example_number = sVar5 + 1;
    (*plVar3->_vptr_loss_function[7])
              ((ulong)(uint)pfVar2[sVar5],(ulong)(ec->l).multi.label,plVar3,psVar4);
    b->curvature = (double)ec->weight * (double)extraout_XMM0_Da_01 * (double)fVar8 * (double)fVar8
                   + b->curvature;
  }
  ec->updated_prediction = (ec->pred).scalar;
  if (b->preconditioner_pass == true) {
    update_preconditioner(all,ec);
    return;
  }
  return;
}

Assistant:

void process_example(vw& all, bfgs& b, example& ec)
{
  label_data& ld = ec.l.simple;
  if (b.first_pass)
    b.importance_weight_sum += ec.weight;

  /********************************************************************/
  /* I) GRADIENT CALCULATION ******************************************/
  /********************************************************************/
  if (b.gradient_pass)
  {
    ec.pred.scalar = predict_and_gradient(all, ec);  // w[0] & w[1]
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    b.loss_sum += ec.loss;
    b.predictions.push_back(ec.pred.scalar);
  }
  /********************************************************************/
  /* II) CURVATURE CALCULATION ****************************************/
  /********************************************************************/
  else  // computing curvature
  {
    float d_dot_x = dot_with_direction(all, ec);   // w[2]
    if (b.example_number >= b.predictions.size())  // Make things safe in case example source is strange.
      b.example_number = b.predictions.size() - 1;
    ec.pred.scalar = b.predictions[b.example_number];
    ec.partial_prediction = b.predictions[b.example_number];
    ec.loss = all.loss->getLoss(all.sd, ec.pred.scalar, ld.label) * ec.weight;
    float sd = all.loss->second_derivative(all.sd, b.predictions[b.example_number++], ld.label);
    b.curvature += ((double)d_dot_x) * d_dot_x * sd * ec.weight;
  }
  ec.updated_prediction = ec.pred.scalar;

  if (b.preconditioner_pass)
    update_preconditioner(all, ec);  // w[3]
}